

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.hpp
# Opt level: O3

bool __thiscall
Args::Command::isMisspelledCommand(Command *this,String *nm,StringList *possibleNames)

{
  bool bVar1;
  String local_48;
  
  (**(code **)(*(long *)this + 0x18))(&local_48,this);
  bVar1 = details::isMisspelledName
                    ((details *)(nm->_M_dataplus)._M_p,(String *)nm->_M_string_length,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (bVar1) {
    (**(code **)(*(long *)this + 0x18))(&local_48,this);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)possibleNames,
               &local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar1;
}

Assistant:

bool isMisspelledCommand(
		//! Name to check (misspelled).
		const String & nm,
		//! List of possible names for the given misspelled name.
		StringList & possibleNames ) const
	{
		if( details::isMisspelledName( nm, name() ) )
		{
			possibleNames.push_back( name() );

			return true;
		}
		else
			return false;
	}